

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int descend_left(saucy *s)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int local_24;
  int local_20;
  int rmin;
  int lmin;
  int target;
  saucy *s_local;
  
  _lmin = s;
  if (s->nsplits == s->splitlev[s->lev]) {
    do {
      iVar2 = at_terminal(_lmin);
      if (iVar2 != 0) {
        return 1;
      }
      (*_lmin->select_decomposition)(_lmin,&rmin,&local_20,&local_24);
      if (_lmin->fPrintTree != 0) {
        uVar1 = _lmin->lev;
        pcVar3 = getVertexName(_lmin->pNtk,(_lmin->left).lab[local_20]);
        pcVar4 = getVertexName(_lmin->pNtk,(_lmin->right).lab[local_24]);
        printf("in level %d: %s->%s\n",(ulong)uVar1,pcVar3,pcVar4);
      }
      _lmin->match = 0;
      _lmin->start[_lmin->lev] = rmin;
      _lmin->split = split_left;
      descend(_lmin,&_lmin->left,rmin,local_20);
      _lmin->splitlev[_lmin->lev] = _lmin->nsplits;
      _lmin->split = split_other;
      _lmin->lev = _lmin->lev + -1;
      _lmin->nsplits = _lmin->splitlev[_lmin->lev];
      _lmin->specmin[_lmin->lev] = (_lmin->right).lab[local_24];
      iVar2 = descend(_lmin,&_lmin->right,rmin,local_24);
      if (iVar2 == 0) {
        return 0;
      }
    } while (_lmin->nsplits == _lmin->splitlev[_lmin->lev]);
  }
  return 0;
}

Assistant:

static int
descend_left(struct saucy *s)
{
    int target, lmin, rmin;

    /* Check that we ended at the right spot */
    if (s->nsplits != s->splitlev[s->lev]) return 0;

    /* Keep going until we're discrete */
    while (!at_terminal(s) /*&& !zeta_fixed(s)*/) {

        /* We can pick any old target cell and element */
        s->select_decomposition(s, &target, &lmin, &rmin);

        if (s->fPrintTree) {
            //printf("in level %d: %d->%d\n", s->lev, s->left.lab[lmin], s->right.lab[rmin]);
            printf("in level %d: %s->%s\n", s->lev, getVertexName(s->pNtk, s->left.lab[lmin]), getVertexName(s->pNtk, s->right.lab[rmin]));
        }

        /* Check if we need to refine on the left */
        s->match = 0;
        s->start[s->lev] = target;
        s->split = split_left;
        if (SELECT_DYNAMICALLY) {
            s->refineBySim1 = refineBySim1_left;
            s->refineBySim2 = refineBySim2_left;
        }
        descend(s, &s->left, target, lmin);
        s->splitlev[s->lev] = s->nsplits;
        s->split = split_other;     
        if (SELECT_DYNAMICALLY) {
            s->refineBySim1 = refineBySim1_other;
            s->refineBySim2 = refineBySim2_other;
        }
        --s->lev;
        s->nsplits = s->splitlev[s->lev];

        /* Now refine on the right and ensure matching */
        s->specmin[s->lev] = s->right.lab[rmin];
        if (!descend(s, &s->right, target, rmin)) return 0;
        if (s->nsplits != s->splitlev[s->lev]) return 0;
    }
    return 1;
}